

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int io_file_readline(lua_State *L,FILE *fp,MSize chop)

{
  TValue *pTVar1;
  uint64_t uVar2;
  char *__s;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  GCstr *pGVar6;
  MSize sz;
  uint uVar7;
  uint local_40;
  
  sz = 0x2000;
  __s = lj_buf_tmp(L,0x2000);
  pcVar3 = fgets(__s,0x2000,(FILE *)fp);
  if (pcVar3 == (char *)0x0) {
    uVar7 = 0;
    local_40 = 0;
  }
  else {
    local_40 = 0;
    uVar7 = 0;
    pcVar3 = __s;
    do {
      sVar4 = strlen(pcVar3);
      uVar7 = (int)sVar4 + uVar7;
      local_40 = local_40 | uVar7;
      if ((uVar7 != 0) && (__s[uVar7 - 1] == '\n')) {
        uVar7 = uVar7 - chop;
        break;
      }
      sz = sz << (sz - 0x40 <= uVar7);
      __s = lj_buf_tmp(L,sz);
      pcVar3 = __s + uVar7;
      pcVar5 = fgets(pcVar3,sz - uVar7,(FILE *)fp);
    } while (pcVar5 != (char *)0x0);
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar6 = lj_str_new(L,__s,(ulong)uVar7);
  pTVar1->u64 = (ulong)pGVar6 | 0xfffd800000000000;
  uVar2 = (L->glref).ptr64;
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
    lj_gc_step(L);
  }
  return local_40;
}

Assistant:

static int io_file_readline(lua_State *L, FILE *fp, MSize chop)
{
  MSize m = LUAL_BUFFERSIZE, n = 0, ok = 0;
  char *buf;
  for (;;) {
    buf = lj_buf_tmp(L, m);
    if (fgets(buf+n, m-n, fp) == NULL) break;
    n += (MSize)strlen(buf+n);
    ok |= n;
    if (n && buf[n-1] == '\n') { n -= chop; break; }
    if (n >= m - 64) m += m;
  }
  setstrV(L, L->top++, lj_str_new(L, buf, (size_t)n));
  lj_gc_check(L);
  return (int)ok;
}